

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerMSL::is_sample_rate(CompilerMSL *this)

{
  ExecutionModel EVar1;
  SmallVector<spv::Capability,_8UL> *pSVar2;
  Capability *pCVar3;
  
  pSVar2 = Compiler::get_declared_capabilities((Compiler *)this);
  EVar1 = Compiler::get_execution_model((Compiler *)this);
  if (EVar1 == ExecutionModelFragment) {
    if ((this->msl_options).force_sample_rate_shading != false) {
      return true;
    }
    pCVar3 = (pSVar2->super_VectorView<spv::Capability>).ptr;
    pCVar3 = ::std::
             __find_if<spv::Capability_const*,__gnu_cxx::__ops::_Iter_equals_val<spv::Capability_const>>
                       (pCVar3,pCVar3 + (pSVar2->super_VectorView<spv::Capability>).buffer_size);
    if (pCVar3 != (pSVar2->super_VectorView<spv::Capability>).ptr +
                  (pSVar2->super_VectorView<spv::Capability>).buffer_size) {
      return true;
    }
    if ((this->msl_options).use_framebuffer_fetch_subpasses == true) {
      return (this->super_CompilerGLSL).super_Compiler.need_subpass_input_ms;
    }
  }
  return false;
}

Assistant:

bool CompilerMSL::is_sample_rate() const
{
	auto &caps = get_declared_capabilities();
	return get_execution_model() == ExecutionModelFragment &&
	       (msl_options.force_sample_rate_shading ||
	        std::find(caps.begin(), caps.end(), CapabilitySampleRateShading) != caps.end() ||
	        (msl_options.use_framebuffer_fetch_subpasses && need_subpass_input_ms));
}